

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O2

void __thiscall symbol_table_visitor::visit(symbol_table_visitor *this,Assignment *ptr)

{
  string *this_00;
  symbol_table_visitor *this_01;
  allocator<char> local_19;
  
  (**(ptr->lvalue->super_Base)._vptr_Base)(ptr->lvalue,this);
  this_01 = (symbol_table_visitor *)ptr->rvalue;
  (**((Base *)&this_01->super_Visitor)->_vptr_Base)(this_01,this);
  if (ptr->lvalue->is_lvalue != false) {
    assert_type(this_01,ptr->rvalue->type,ptr->lvalue->type);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,"syntax error: not lvalue in left part of assignment",&local_19);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void symbol_table_visitor::visit(Assignment* ptr) {
    ptr->lvalue->accept(this);
    ptr->rvalue->accept(this);
    if (!ptr->lvalue->is_lvalue) {
        throw std::string("syntax error: not lvalue in left part of assignment");
    }
    assert_type(ptr->rvalue->type, ptr->lvalue->type);
}